

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::MaterialNode> __thiscall
embree::XMLLoader::addMaterial(XMLLoader *this,string *type,Parms *parms)

{
  bool bVar1;
  MetalMaterial *this_00;
  OBJMaterial *pOVar2;
  ostream *poVar3;
  Parms *in_RCX;
  string *this_01;
  float fVar4;
  float fVar5;
  Vec3fa Ka;
  Vec3fa reflectance;
  shared_ptr<embree::Texture> map_Ka;
  shared_ptr<embree::Texture> map_Kt;
  shared_ptr<embree::Texture> map_Ks;
  shared_ptr<embree::Texture> map_Kd;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_128;
  shared_ptr<embree::Texture> map_Displ;
  shared_ptr<embree::Texture> map_Ns;
  Vec3fa Kd;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_c8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_b8;
  __shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> local_a8;
  Vec3fa Kt;
  Vec3fa Ks;
  string local_70;
  string local_50;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)parms
                          ,"Matte");
  if (bVar1) {
    Ka.field_0._0_8_ = 0x3f8000003f800000;
    Ka.field_0._8_8_ = 0x3f8000003f800000;
    Parms::getVec3fa((Parms *)&reflectance,(char *)in_RCX,(Vec3fa *)"reflectance");
    this_00 = (MetalMaterial *)SceneGraph::MaterialNode::operator_new(0x90);
    MatteMaterial::MatteMaterial((MatteMaterial *)this_00,&reflectance);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            parms,"Mirror");
    if (bVar1) {
      Ka.field_0._0_8_ = 0x3f8000003f800000;
      Ka.field_0._8_8_ = 0x3f8000003f800000;
      Parms::getVec3fa((Parms *)&reflectance,(char *)in_RCX,(Vec3fa *)"reflectance");
      this_00 = (MetalMaterial *)SceneGraph::MaterialNode::operator_new(0x90);
      MirrorMaterial::MirrorMaterial((MirrorMaterial *)this_00,&reflectance);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              parms,"OBJ");
      if (bVar1) {
        fVar4 = Parms::getFloat(in_RCX,"d",1.0);
        Parms::getTexture((Parms *)&reflectance,(char *)in_RCX);
        map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Parms::getVec3fa((Parms *)&Ka,(char *)in_RCX,(Vec3fa *)0x22441a);
        Parms::getTexture((Parms *)&map_Ka,(char *)in_RCX);
        map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x3f8000003f800000;
        map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f8000003f800000;
        Parms::getVec3fa((Parms *)&Kd,(char *)in_RCX,(Vec3fa *)0x224428);
        Parms::getTexture((Parms *)&map_Kd,(char *)in_RCX);
        map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Parms::getVec3fa((Parms *)&Ks,(char *)in_RCX,(Vec3fa *)0x224436);
        Parms::getTexture((Parms *)&map_Ks,(char *)in_RCX);
        map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Parms::getVec3fa((Parms *)&Kt,(char *)in_RCX,(Vec3fa *)0x224444);
        Parms::getTexture((Parms *)&map_Kt,(char *)in_RCX);
        fVar5 = Parms::getFloat(in_RCX,"Ns",10.0);
        Parms::getTexture((Parms *)&map_Ns,(char *)in_RCX);
        Parms::getTexture((Parms *)&map_Displ,(char *)in_RCX);
        pOVar2 = (OBJMaterial *)SceneGraph::MaterialNode::operator_new(0x180);
        std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_128,
                   (__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2> *)&reflectance);
        std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_138,
                   &map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_a8,&map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                  );
        std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_b8,&map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                  );
        std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_c8,&map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                  );
        std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_d8,&map_Ns.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>
                  );
        std::__shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_e8,
                   &map_Displ.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>);
        OBJMaterial::OBJMaterial
                  (pOVar2,fVar4,(shared_ptr<embree::Texture> *)&local_128,&Ka,
                   (shared_ptr<embree::Texture> *)&local_138,&Kd,
                   (shared_ptr<embree::Texture> *)&local_a8,&Ks,
                   (shared_ptr<embree::Texture> *)&local_b8,&Kt,
                   (shared_ptr<embree::Texture> *)&local_c8,fVar5,
                   (shared_ptr<embree::Texture> *)&local_d8,(shared_ptr<embree::Texture> *)&local_e8
                  );
        (this->path).filename._M_dataplus._M_p = (pointer)pOVar2;
        (**(code **)(*(long *)&(pOVar2->super_MaterialNode).super_Node.super_RefCount + 0x10))
                  (pOVar2);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&map_Displ.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&map_Ns.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&map_Kt.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&map_Ks.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&map_Kd.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&reflectance.field_0 + 8));
        return (Ref<embree::SceneGraph::MaterialNode>)(MaterialNode *)this;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              parms,"OBJMaterial");
      if (bVar1) {
        fVar4 = Parms::getFloat(in_RCX,"d",1.0);
        Ka.field_0._0_8_ = 0x3f8000003f800000;
        Ka.field_0._8_8_ = 0x3f8000003f800000;
        Parms::getVec3fa((Parms *)&reflectance,(char *)in_RCX,(Vec3fa *)"kd");
        map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Parms::getVec3fa((Parms *)&Ka,(char *)in_RCX,(Vec3fa *)0x228b92);
        fVar5 = Parms::getFloat(in_RCX,"ns",10.0);
        pOVar2 = (OBJMaterial *)SceneGraph::MaterialNode::operator_new(0x180);
        std::__cxx11::string::string((string *)&local_50,"",(allocator *)&map_Ka);
        OBJMaterial::OBJMaterial(pOVar2,fVar4,&reflectance,&Ka,fVar5,&local_50);
        (this->path).filename._M_dataplus._M_p = (pointer)pOVar2;
        (**(code **)(*(long *)&(pOVar2->super_MaterialNode).super_Node.super_RefCount + 0x10))
                  (pOVar2);
        this_01 = &local_50;
LAB_00172b04:
        std::__cxx11::string::~string((string *)this_01);
        return (Ref<embree::SceneGraph::MaterialNode>)(MaterialNode *)this;
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              parms,"ThinDielectric");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)parms,"ThinGlass"), bVar1)) {
        Ka.field_0._0_8_ = 0x3f8000003f800000;
        Ka.field_0._8_8_ = 0x3f8000003f800000;
        Parms::getVec3fa((Parms *)&reflectance,(char *)in_RCX,(Vec3fa *)"transmission");
        fVar4 = Parms::getFloat(in_RCX,"eta",1.4);
        fVar5 = Parms::getFloat(in_RCX,"thickness",0.1);
        this_00 = (MetalMaterial *)SceneGraph::MaterialNode::operator_new(0xb0);
        ThinDielectricMaterial::ThinDielectricMaterial
                  ((ThinDielectricMaterial *)this_00,&reflectance,fVar4,fVar5);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )parms,"Plastic");
        if (bVar1) {
          Ka.field_0._0_8_ = 0x3f8000003f800000;
          Ka.field_0._8_8_ = 0x3f8000003f800000;
          Parms::getVec3fa((Parms *)&reflectance,(char *)in_RCX,(Vec3fa *)"pigmentColor");
          fVar4 = Parms::getFloat(in_RCX,"eta",1.4);
          fVar5 = Parms::getFloat(in_RCX,"roughness",0.01);
          this_00 = (MetalMaterial *)SceneGraph::MaterialNode::operator_new(0xb0);
          MetallicPaintMaterial::MetallicPaintMaterial
                    ((MetallicPaintMaterial *)this_00,&reflectance,&reflectance,fVar5,fVar4);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)parms,"Metal");
          if (bVar1) {
            Ka.field_0._0_8_ = 0x3f8000003f800000;
            Ka.field_0._8_8_ = 0x3f8000003f800000;
            Parms::getVec3fa((Parms *)&reflectance,(char *)in_RCX,(Vec3fa *)"reflectance");
            map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x3fb333333fb33333;
            map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fb333333fb33333;
            Parms::getVec3fa((Parms *)&Ka,(char *)in_RCX,(Vec3fa *)0x224521);
            Kd.field_0._0_8_ = 0;
            Kd.field_0._8_8_ = 0;
            Parms::getVec3fa((Parms *)&map_Ka,(char *)in_RCX,(Vec3fa *)0x22d985);
            fVar4 = Parms::getFloat(in_RCX,"roughness",0.01);
            this_00 = (MetalMaterial *)SceneGraph::MaterialNode::operator_new(0xc0);
            if ((fVar4 != 0.0) || (NAN(fVar4))) {
              MetalMaterial::MetalMaterial(this_00,&reflectance,&Ka,(Vec3fa *)&map_Ka,fVar4);
            }
            else {
              MetalMaterial::MetalMaterial(this_00,&reflectance,&Ka,(Vec3fa *)&map_Ka);
            }
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)parms,"Velvet");
            if (bVar1) {
              Ka.field_0._0_8_ = 0x3f8000003f800000;
              Ka.field_0._8_8_ = 0x3f8000003f800000;
              Parms::getVec3fa((Parms *)&reflectance,(char *)in_RCX,(Vec3fa *)"reflectance");
              fVar4 = Parms::getFloat(in_RCX,"backScattering",0.0);
              map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x3f8000003f800000;
              map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f8000003f800000;
              Parms::getVec3fa((Parms *)&Ka,(char *)in_RCX,(Vec3fa *)"horizonScatteringColor");
              fVar5 = Parms::getFloat(in_RCX,"horizonScatteringFallOff",0.0);
              this_00 = (MetalMaterial *)SceneGraph::MaterialNode::operator_new(0xb0);
              VelvetMaterial::VelvetMaterial((VelvetMaterial *)this_00,&reflectance,fVar4,&Ka,fVar5)
              ;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)parms,"Dielectric");
              if (bVar1) {
                Ka.field_0._0_8_ = 0x3f8000003f800000;
                Ka.field_0._8_8_ = 0x3f8000003f800000;
                Parms::getVec3fa((Parms *)&reflectance,(char *)in_RCX,
                                 (Vec3fa *)"transmissionOutside");
                map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)0x3f8000003f800000;
                map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3f8000003f800000;
                Parms::getVec3fa((Parms *)&Ka,(char *)in_RCX,(Vec3fa *)"transmission");
                fVar4 = Parms::getFloat(in_RCX,"etaOutside",1.0);
                fVar5 = Parms::getFloat(in_RCX,"etaInside",1.4);
                this_00 = (MetalMaterial *)SceneGraph::MaterialNode::operator_new(0xb0);
                DielectricMaterial::DielectricMaterial
                          ((DielectricMaterial *)this_00,&reflectance,&Ka,fVar4,fVar5);
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)parms,"MetallicPaint");
                if (bVar1) {
                  Ka.field_0._0_8_ = 0x3f8000003f800000;
                  Ka.field_0._8_8_ = 0x3f8000003f800000;
                  Parms::getVec3fa((Parms *)&reflectance,(char *)in_RCX,(Vec3fa *)"shadeColor");
                  map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  Parms::getVec3fa((Parms *)&Ka,(char *)in_RCX,(Vec3fa *)"glitterColor");
                  fVar4 = Parms::getFloat(in_RCX,"glitterSpread",1.0);
                  fVar5 = Parms::getFloat(in_RCX,"eta",1.4);
                  this_00 = (MetalMaterial *)SceneGraph::MaterialNode::operator_new(0xb0);
                  MetallicPaintMaterial::MetallicPaintMaterial
                            ((MetallicPaintMaterial *)this_00,&reflectance,&Ka,fVar4,fVar5);
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)parms,"Hair");
                  if (!bVar1) {
                    poVar3 = std::operator<<((ostream *)&std::cout,"Warning: unsupported material ")
                    ;
                    poVar3 = std::operator<<(poVar3,(string *)parms);
                    std::endl<char,std::char_traits<char>>(poVar3);
                    pOVar2 = (OBJMaterial *)SceneGraph::MaterialNode::operator_new(0x180);
                    reflectance.field_0._0_8_ = 0x3f0000003f000000;
                    reflectance.field_0._8_8_ = 0x3f0000003f000000;
                    Ka.field_0._0_8_ = 0;
                    Ka.field_0._8_8_ = 0;
                    std::__cxx11::string::string((string *)&local_70,"",(allocator *)&map_Ka);
                    OBJMaterial::OBJMaterial(pOVar2,1.0,&reflectance,&Ka,0.0,&local_70);
                    (this->path).filename._M_dataplus._M_p = (pointer)pOVar2;
                    (**(code **)(*(long *)&(pOVar2->super_MaterialNode).super_Node.super_RefCount +
                                0x10))(pOVar2);
                    this_01 = &local_70;
                    goto LAB_00172b04;
                  }
                  Ka.field_0._0_8_ = 0x3f8000003f800000;
                  Ka.field_0._8_8_ = 0x3f8000003f800000;
                  Parms::getVec3fa((Parms *)&reflectance,(char *)in_RCX,(Vec3fa *)"Kr");
                  map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                       (element_type *)0x0;
                  map_Ka.super___shared_ptr<embree::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  Parms::getVec3fa((Parms *)&Ka,(char *)in_RCX,(Vec3fa *)0x224444);
                  fVar4 = Parms::getFloat(in_RCX,"nx",20.0);
                  fVar5 = Parms::getFloat(in_RCX,"ny",2.0);
                  this_00 = (MetalMaterial *)SceneGraph::MaterialNode::operator_new(0xb0);
                  HairMaterial::HairMaterial((HairMaterial *)this_00,&reflectance,&Ka,fVar4,fVar5);
                }
              }
            }
          }
        }
      }
    }
  }
  (this->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)(*(long *)&(this_00->super_MaterialNode).super_Node.super_RefCount + 0x10))(this_00);
  return (Ref<embree::SceneGraph::MaterialNode>)(MaterialNode *)this;
}

Assistant:

Ref<SceneGraph::MaterialNode> XMLLoader::addMaterial(const std::string& type, const Parms& parms) 
  {
    if (type == "Matte")
    {
      const Vec3fa reflectance = parms.getVec3fa("reflectance",one);
      return new MatteMaterial(reflectance);
    }
    else if (type == "Mirror")
    {
      const Vec3fa reflectance = parms.getVec3fa("reflectance",one);
      return new MirrorMaterial(reflectance);
    }
    else if (type == "OBJ") 
    {
      const float d = parms.getFloat("d", 1.0f);
      const std::shared_ptr<Texture> map_d = parms.getTexture("map_d");  
      const Vec3fa Ka = parms.getVec3fa("Ka", zero);
      const std::shared_ptr<Texture> map_Ka = parms.getTexture("map_Ka");  
      const Vec3fa Kd = parms.getVec3fa("Kd", one);
      const std::shared_ptr<Texture> map_Kd = parms.getTexture("map_Kd");  
      const Vec3fa Ks = parms.getVec3fa("Ks", zero);
      const std::shared_ptr<Texture> map_Ks = parms.getTexture("map_Ks");  
      const Vec3fa Kt = parms.getVec3fa("Kt", zero);
      const std::shared_ptr<Texture> map_Kt = parms.getTexture("map_Kt");  
      const float Ns = parms.getFloat("Ns", 10.0f); 
      const std::shared_ptr<Texture> map_Ns = parms.getTexture("map_Ns");  
      const std::shared_ptr<Texture> map_Displ = parms.getTexture("map_Displ");
      return new OBJMaterial(d,map_d,Ka,map_Ka,Kd,map_Kd,Ks,map_Ks,Kt,map_Kt,Ns,map_Ns,map_Displ);
    }
    else if (type == "OBJMaterial")  // for BGF file format
    {
      //map_d = parms.getTexture("map_d");  
      const float d = parms.getFloat("d", 1.0f);
      //map_Kd = parms.getTexture("map_kd");  
      const Vec3fa Kd = parms.getVec3fa("kd", one);
      //map_Ks = parms.getTexture("map_ks");  
      const Vec3fa Ks = parms.getVec3fa("ks", zero);
      //map_Ns = parms.getTexture("map_ns");  
      const float Ns = parms.getFloat("ns", 10.0f);
      //map_Bump = parms.getTexture("map_Bump");
      return new OBJMaterial(d,Kd,Ks,Ns);
    }
    else if (type == "ThinDielectric" || type == "ThinGlass")
    {
      const Vec3fa transmission = parms.getVec3fa("transmission",one);
      const float eta          = parms.getFloat("eta",1.4f);
      const float thickness    = parms.getFloat("thickness",0.1f);
      return new ThinDielectricMaterial(transmission,eta,thickness);
    }
    else if (type == "Plastic")
    {
      const Vec3fa pigmentColor = parms.getVec3fa("pigmentColor",one);
      const float eta          = parms.getFloat("eta",1.4f);
      const float roughness    = parms.getFloat("roughness",0.01f);
      return new MetallicPaintMaterial(pigmentColor,pigmentColor,roughness,eta);
    }
    else if (type == "Metal")
    {
      const Vec3fa reflectance  = parms.getVec3fa("reflectance",one);
      const Vec3fa eta          = parms.getVec3fa("eta",Vec3fa(1.4f));
      const Vec3fa k            = parms.getVec3fa("k",Vec3fa(0.0f));
      const float roughness     = parms.getFloat("roughness",0.01f);
      if (roughness == 0.0f)
        return new MetalMaterial(reflectance,eta,k);
      else 
        return new MetalMaterial(reflectance,eta,k,roughness);
    }
    else if (type == "Velvet")
    {
      const Vec3fa reflectance = parms.getVec3fa("reflectance",one);
      const float backScattering = parms.getFloat("backScattering",zero);
      const Vec3fa horizonScatteringColor = parms.getVec3fa("horizonScatteringColor",one);
      const float horizonScatteringFallOff = parms.getFloat("horizonScatteringFallOff",zero);
      return new VelvetMaterial(reflectance,backScattering,horizonScatteringColor,horizonScatteringFallOff);
    }
    else if (type == "Dielectric")
    {
      const Vec3fa transmissionOutside = parms.getVec3fa("transmissionOutside",one);
      const Vec3fa transmissionInside  = parms.getVec3fa("transmission",one);
      const float etaOutside = parms.getFloat("etaOutside",1.0f);
      const float etaInside  = parms.getFloat("etaInside",1.4f);
      return new DielectricMaterial(transmissionOutside,transmissionInside,etaOutside,etaInside);
    }
    else if (type == "MetallicPaint")
    {
      const Vec3fa shadeColor    = parms.getVec3fa("shadeColor",one);
      const Vec3fa glitterColor  = parms.getVec3fa("glitterColor",zero);
      const float glitterSpread = parms.getFloat("glitterSpread",1.0f);
      const float eta           = parms.getFloat("eta",1.4f);
      return new MetallicPaintMaterial(shadeColor,glitterColor,glitterSpread,eta);
    }
    else if (type == "Hair")
    {
      const Vec3fa Kr = parms.getVec3fa("Kr",one);
      const Vec3fa Kt = parms.getVec3fa("Kt",zero);
      const float nx = parms.getFloat("nx",20.0f);
      const float ny = parms.getFloat("ny",2.0f);
      return new HairMaterial(Kr,Kt,nx,ny);
    }
    else {
      std::cout << "Warning: unsupported material " << type << std::endl;
      return new OBJMaterial(1.0f,Vec3fa(0.5f),Vec3fa(0.0f),0.0f);
    }
  }